

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void CChat::Com_Whisper(IResult *pResult,void *pContext)

{
  int Mode;
  CConfig *pCVar1;
  long in_RSI;
  long *in_RDI;
  int TargetID;
  CChat *pChatData;
  SCommandContext *pCommandContext;
  CChat *in_stack_ffffffffffffffd0;
  CGameClient *pName;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CChat *this;
  
  this = *(CChat **)(in_RSI + 0x18);
  pCVar1 = CComponent::Config((CComponent *)0x14c834);
  if (pCVar1->m_ClDisableWhisper == 0) {
    pName = (this->super_CComponent).m_pClient;
    (**(code **)(*in_RDI + 0x20))(in_RDI,0);
    Mode = CGameClient::GetClientID
                     ((CGameClient *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (char *)pName);
    if (Mode != -1) {
      this->m_WhisperTarget = Mode;
      EnableMode(this,Mode,(char *)pName);
    }
  }
  else {
    ClearInput(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void CChat::Com_Whisper(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	if(pChatData->Config()->m_ClDisableWhisper)
	{
		pChatData->ClearInput();
		return;
	}

	int TargetID = pChatData->m_pClient->GetClientID(pResult->GetString(0));
	if(TargetID != -1)
	{
		pChatData->m_WhisperTarget = TargetID;
		pChatData->EnableMode(CHAT_WHISPER);
	}
}